

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.cpp
# Opt level: O3

double * __thiscall DummyClass<double>::fun(DummyClass<double> *this,double *res,int t)

{
  _List_node_base *p_Var1;
  double dVar2;
  
  this->call = this->call + 1;
  this->timedata = t;
  for (p_Var1 = (this->inputsig).
                super__List_base<dynamicgraph::SignalTimeDependent<double,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<double,_int>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->inputsig; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x20))(p_Var1[1]._M_next,&this->timedata);
  }
  for (p_Var1 = (this->inputsigV).
                super__List_base<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->inputsigV; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x20))(p_Var1[1]._M_next,&this->timedata);
  }
  dVar2 = (double)(this->timedata * this->call);
  this->res = dVar2;
  *res = dVar2;
  return res;
}

Assistant:

T &fun(T &res, int t) {
    ++call;
    timedata = t;

    BOOST_FOREACH (sigDouble_t *ptr, inputsig) ptr->access(timedata);

    BOOST_FOREACH (sigString_t *ptr, inputsigV) ptr->access(timedata);

    res = (*this)();
    return res;
  }